

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int32_t lj_ffrecord_select_mode(jit_State *J,TRef tr,TValue *tv)

{
  TRef TVar1;
  TRef TVar2;
  int32_t start;
  TRef trchar;
  TRef trptr;
  TValue *tv_local;
  TRef tr_local;
  jit_State *J_local;
  
  if (((tr & 0x1f000000) == 0x4000000) && (*(char *)((tv->u64 & 0x7fffffffffff) + 0x18) == '#')) {
    if (*(int *)((tv->u64 & 0x7fffffffffff) + 0x14) == 1) {
      TVar1 = lj_ir_kgc(J,(GCobj *)(tv->u64 & 0x7fffffffffff),IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = (IRRef1)tr;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      lj_opt_fold(J);
    }
    else {
      TVar1 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x4009;
      (J->fold).ins.field_0.op1 = (IRRef1)tr;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar1 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x4610;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = 1;
      TVar1 = lj_opt_fold(J);
      TVar2 = lj_ir_kint(J,0x23);
      (J->fold).ins.field_0.ot = 0x893;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
    }
    J_local._4_4_ = 0;
  }
  else {
    J_local._4_4_ = argv2int(J,tv);
    if (J_local._4_4_ == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  return J_local._4_4_;
}

Assistant:

int32_t lj_ffrecord_select_mode(jit_State *J, TRef tr, TValue *tv)
{
  if (tref_isstr(tr) && *strVdata(tv) == '#') {  /* select('#', ...) */
    if (strV(tv)->len == 1) {
      emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, strV(tv)));
    } else {
      TRef trptr = emitir(IRT(IR_STRREF, IRT_PGC), tr, lj_ir_kint(J, 0));
      TRef trchar = emitir(IRT(IR_XLOAD, IRT_U8), trptr, IRXLOAD_READONLY);
      emitir(IRTGI(IR_EQ), trchar, lj_ir_kint(J, '#'));
    }
    return 0;
  } else {  /* select(n, ...) */
    int32_t start = argv2int(J, tv);
    if (start == 0) lj_trace_err(J, LJ_TRERR_BADTYPE);  /* A bit misleading. */
    return start;
  }
}